

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstructorCache.h
# Opt level: O0

DynamicType * __thiscall Js::ConstructorCache::GetType(ConstructorCache *this)

{
  code *pcVar1;
  bool bVar2;
  CtorCacheGuardValues CVar3;
  undefined4 *puVar4;
  DynamicType *pDVar5;
  ConstructorCache *this_local;
  
  CVar3 = PropertyGuard::GetValue(&this->super_PropertyGuard);
  CVar3 = Js::operator&(CVar3,Special);
  if (CVar3 != Invalid) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Language/ConstructorCache.h"
                                ,0x58,
                                "(static_cast<intptr_t>((CtorCacheGuardValues)__super::GetValue() & CtorCacheGuardValues::TagFlag) == 0)"
                                ,
                                "static_cast<intptr_t>((CtorCacheGuardValues)__super::GetValue() & CtorCacheGuardValues::TagFlag) == 0"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pDVar5 = (DynamicType *)PropertyGuard::GetValue(&this->super_PropertyGuard);
  return pDVar5;
}

Assistant:

DynamicType* GetType() const
        {
            Assert(static_cast<intptr_t>((CtorCacheGuardValues)__super::GetValue() & CtorCacheGuardValues::TagFlag) == 0);
            return reinterpret_cast<DynamicType*>(__super::GetValue());
        }